

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_gej_eq_x_var(secp256k1_fe *x,secp256k1_gej *a)

{
  int iVar1;
  secp256k1_fe *in_RSI;
  secp256k1_fe *in_RDI;
  secp256k1_fe r;
  secp256k1_fe *in_stack_ffffffffffffffc8;
  secp256k1_fe *in_stack_ffffffffffffffd0;
  secp256k1_fe *in_stack_ffffffffffffffe8;
  
  secp256k1_fe_verify(in_RDI);
  secp256k1_gej_verify((secp256k1_gej *)0x10dd62);
  secp256k1_fe_impl_sqr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  secp256k1_fe_impl_mul
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(secp256k1_fe *)0x10dd83);
  iVar1 = secp256k1_fe_equal(in_RSI,in_stack_ffffffffffffffe8);
  return iVar1;
}

Assistant:

static int secp256k1_gej_eq_x_var(const secp256k1_fe *x, const secp256k1_gej *a) {
    secp256k1_fe r;
    SECP256K1_FE_VERIFY(x);
    SECP256K1_GEJ_VERIFY(a);
    VERIFY_CHECK(!a->infinity);

    secp256k1_fe_sqr(&r, &a->z); secp256k1_fe_mul(&r, &r, x);
    return secp256k1_fe_equal(&r, &a->x);
}